

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O2

char * bstr_make_cstr(uint8_t *pBegin,uint8_t *pEnd)

{
  char *__dest;
  ulong __n;
  
  if (pBegin < pEnd && pBegin != (uint8_t *)0x0) {
    __dest = (char *)malloc((ulong)((int)((long)pEnd - (long)pBegin) + 1));
    if (__dest != (char *)0x0) {
      __n = (long)pEnd - (long)pBegin & 0xffffffff;
      memcpy(__dest,pBegin,__n);
      __dest[__n] = '\0';
      return __dest;
    }
  }
  return (char *)0x0;
}

Assistant:

char* bstr_make_cstr(const uint8_t *pBegin, const uint8_t *pEnd){
   if( (pBegin != 0) && (pEnd != 0) && (pBegin<pEnd)){
      uint32_t len = (uint32_t) (pEnd-pBegin);
      uint8_t *str = (uint8_t*) malloc(len+1);
      if(str != 0){
         memcpy(str,pBegin,len);
         str[len]=0;
      }
      return (char*) str;
   }
   return 0;
}